

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * GetFileExtension(string *fileName)

{
  long lVar1;
  char *in_RSI;
  allocator local_19;
  char *local_18;
  string *fileName_local;
  
  local_18 = in_RSI;
  fileName_local = fileName;
  lVar1 = std::__cxx11::string::find_last_of(in_RSI,0x110159);
  if (lVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)fileName,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::string::find_last_of(local_18,0x110159);
    std::__cxx11::string::substr((ulong)fileName,(ulong)local_18);
  }
  return fileName;
}

Assistant:

string GetFileExtension(const string& fileName)
{
    if(fileName.find_last_of(".") != std::string::npos)
        return fileName.substr(fileName.find_last_of(".")+1);
    return "";
}